

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

void __thiscall
acto::core::runtime_t::handle_message
          (runtime_t *this,object_t *obj,
          unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg)

{
  actor *this_00;
  lock_guard<std::mutex> local_48;
  lock_guard<std::mutex> g;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> local_30;
  active_actor_guard local_28;
  active_actor_guard guard;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg_local;
  object_t *obj_local;
  runtime_t *this_local;
  
  guard.saved_value_ = (object_t *)msg;
  if (obj->impl != (actor *)0x0) {
    anon_unknown_0::active_actor_guard::active_actor_guard(&local_28,obj);
    this_00 = obj->impl;
    std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::unique_ptr
              (&local_30,msg);
    actor::consume_package(this_00,&local_30);
    std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::~unique_ptr
              (&local_30);
    anon_unknown_0::active_actor_guard::~active_actor_guard(&local_28);
    if ((obj->impl->terminating_ & 1U) != 0) {
      std::lock_guard<std::mutex>::lock_guard(&local_48,&obj->cs);
      obj->field_0x60 = obj->field_0x60 & 0xfb | 4;
      std::lock_guard<std::mutex>::~lock_guard(&local_48);
    }
    return;
  }
  __assert_fail("obj->impl",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/src/runtime.cpp"
                ,0xbb,
                "virtual void acto::core::runtime_t::handle_message(object_t *, std::unique_ptr<msg_t>)"
               );
}

Assistant:

void runtime_t::handle_message(object_t* obj, std::unique_ptr<msg_t> msg) {
  assert(obj->impl);

  {
    active_actor_guard guard(obj);

    obj->impl->consume_package(std::move(msg));
  }

  if (obj->impl->terminating_) {
    std::lock_guard<std::mutex> g(obj->cs);
    obj->deleting = true;
  }
}